

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
          (QMovableArrayOps<QRect> *this,qsizetype i,QRect *args)

{
  undefined8 uVar1;
  undefined1 uVar2;
  uint uVar3;
  qsizetype qVar4;
  QRect *pQVar5;
  undefined8 *in_RDX;
  QArrayDataPointer<QRect> *in_RSI;
  QArrayDataPointer<QRect> *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QRect tmp;
  QRect *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar7;
  undefined2 in_stack_ffffffffffffffa4;
  byte bVar8;
  Inserter local_40;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QArrayDataPointer<QRect>::needsDetach
                    ((QArrayDataPointer<QRect> *)
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  if (!(bool)uVar2) {
    if ((in_RSI == (QArrayDataPointer<QRect> *)in_RDI->size) &&
       (qVar4 = QArrayDataPointer<QRect>::freeSpaceAtEnd(in_RDI), qVar4 != 0)) {
      pQVar5 = QArrayDataPointer<QRect>::end
                         ((QArrayDataPointer<QRect> *)
                          CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      uVar1 = *in_RDX;
      pQVar5->x1 = (Representation)(int)uVar1;
      pQVar5->y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
      uVar1 = in_RDX[1];
      pQVar5->x2 = (Representation)(int)uVar1;
      pQVar5->y2 = (Representation)(int)((ulong)uVar1 >> 0x20);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0065d576;
    }
    if ((in_RSI == (QArrayDataPointer<QRect> *)0x0) &&
       (qVar4 = QArrayDataPointer<QRect>::freeSpaceAtBegin(in_RDI), qVar4 != 0)) {
      pQVar5 = QArrayDataPointer<QRect>::begin((QArrayDataPointer<QRect> *)0x65d43d);
      uVar1 = *in_RDX;
      pQVar5[-1].x1 = (Representation)(int)uVar1;
      pQVar5[-1].y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
      uVar1 = in_RDX[1];
      pQVar5[-1].x2 = (Representation)(int)uVar1;
      pQVar5[-1].y2 = (Representation)(int)((ulong)uVar1 >> 0x20);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0065d576;
    }
  }
  local_18 = *in_RDX;
  local_10 = in_RDX[1];
  bVar6 = in_RDI->size != 0;
  uVar7 = bVar6 && in_RSI == (QArrayDataPointer<QRect> *)0x0;
  uVar3 = (uint)(bVar6 && in_RSI == (QArrayDataPointer<QRect> *)0x0);
  bVar8 = uVar7;
  QArrayDataPointer<QRect>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
             CONCAT17(uVar2,CONCAT16(uVar7,CONCAT24(in_stack_ffffffffffffffa4,uVar3))),
             (QRect **)in_RDI,(QArrayDataPointer<QRect> *)CONCAT17(uVar7,in_stack_ffffffffffffff90))
  ;
  if ((bVar8 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar2,CONCAT16(bVar8,CONCAT24(in_stack_ffffffffffffffa4,uVar3))),
                       in_RDI,CONCAT17(uVar7,in_stack_ffffffffffffff90),
                       (qsizetype)in_stack_ffffffffffffff88);
    Inserter::insertOne((Inserter *)CONCAT17(uVar7,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
    Inserter::~Inserter(&local_40);
  }
  else {
    pQVar5 = QArrayDataPointer<QRect>::begin((QArrayDataPointer<QRect> *)0x65d510);
    pQVar5[-1].x1 = (Representation)(undefined4)local_18;
    pQVar5[-1].y1 = (Representation)local_18._4_4_;
    pQVar5[-1].x2 = (Representation)(undefined4)local_10;
    pQVar5[-1].y2 = (Representation)local_10._4_4_;
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
LAB_0065d576:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }